

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.hpp
# Opt level: O0

void __thiscall Excel::Formula::parse(Formula *this,Record *record)

{
  Stream *pSVar1;
  Record *in_RSI;
  undefined4 *in_RDI;
  unsigned_long_long isString;
  unsigned_long_long isEmpty;
  long *in_stack_00000018;
  uchar error;
  unsigned_long_long isError;
  unsigned_long_long isBool;
  anon_union_8_2_91d51eec doubleAsLongLong;
  ulong local_18;
  
  Record::dataStream(in_RSI);
  Stream::read<short>((Stream *)isError,(short *)in_stack_00000018,isEmpty._4_4_);
  Record::dataStream(in_RSI);
  Stream::read<short>((Stream *)isError,(short *)in_stack_00000018,isEmpty._4_4_);
  pSVar1 = Record::dataStream(in_RSI);
  (*pSVar1->_vptr_Stream[4])(pSVar1,2,1);
  Record::dataStream(in_RSI);
  Stream::read<long>((Stream *)isError,in_stack_00000018,isEmpty._4_4_);
  if ((local_18 & 0xffffffffff00ffff) == 0xffff000000000001) {
    *(bool *)(in_RDI + 5) = (long)(local_18 & 0xff0000) >> 0x10 != 0;
    *in_RDI = 2;
  }
  else if ((local_18 & 0xffffffffff00ffff) == 0xffff000000000002) {
    in_RDI[4] = (uint)(byte)(local_18 >> 0x10);
    *in_RDI = 3;
  }
  else if ((local_18 & 0xffffffffff00ffff) == 0xffff000000000003) {
    *in_RDI = 5;
  }
  else if (local_18 == 0xffff000000000000) {
    *in_RDI = 4;
  }
  else {
    *(ulong *)(in_RDI + 2) = local_18;
    *in_RDI = 1;
  }
  return;
}

Assistant:

inline void
Formula::parse( Record & record )
{
	record.dataStream().read( m_row, 2 );
	record.dataStream().read( m_column, 2 );

	record.dataStream().seek( 2, Stream::FromCurrent );

	union {
		double m_double;
		int64_t m_long;
	} doubleAsLongLong;

	record.dataStream().read( doubleAsLongLong.m_long, 8 );

	unsigned long long isBool = doubleAsLongLong.m_long & 0xFFFFFFFFFF00FFFF;

	if( isBool == 0xFFFF000000000001 )
	{
		m_boolValue = ( doubleAsLongLong.m_long & 0x0000000000FF0000 ) >> 16;
		m_valueType = BooleanValue;

		return;
	}

	unsigned long long isError = doubleAsLongLong.m_long & 0xFFFFFFFFFF00FFFF;

	if( isError == 0xFFFF000000000002 )
	{
		unsigned char error =
			static_cast< unsigned char >
				( ( doubleAsLongLong.m_long & 0x0000000000FF0000 ) >> 16 );

		m_errorValue = (ErrorValues) error;
		m_valueType = ErrorValue;

		return;
	}

	unsigned long long isEmpty = doubleAsLongLong.m_long & 0xFFFFFFFFFF00FFFF;

	if( isEmpty == 0xFFFF000000000003 )
	{
		m_valueType = EmptyCell;

		return;
	}

	unsigned long long isString = doubleAsLongLong.m_long & 0xFFFFFFFFFFFFFFFF;

	if( isString == 0xFFFF000000000000 )
	{
		m_valueType = StringValue;

		return;
	}

	m_doubleValue = doubleAsLongLong.m_double;
	m_valueType = DoubleValue;
}